

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ly_common.c
# Opt level: O0

LY_ERR ly_parse_uint(char *val_str,size_t val_len,uint64_t max,int base,uint64_t *ret)

{
  char *__nptr;
  int *piVar1;
  ulonglong uVar2;
  ushort **ppuVar3;
  uint64_t u;
  char *str;
  char *ptr;
  uint64_t *puStack_38;
  LY_ERR rc;
  uint64_t *ret_local;
  uint64_t uStack_28;
  int base_local;
  uint64_t max_local;
  size_t val_len_local;
  char *val_str_local;
  
  ptr._4_4_ = LY_SUCCESS;
  puStack_38 = ret;
  ret_local._4_4_ = base;
  uStack_28 = max;
  max_local = val_len;
  val_len_local = (size_t)val_str;
  if (val_str == (char *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","val_str","ly_parse_uint")
    ;
    val_str_local._4_4_ = LY_EINVAL;
  }
  else if (*val_str == '\0') {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","val_str[0]",
           "ly_parse_uint");
    val_str_local._4_4_ = LY_EINVAL;
  }
  else if (val_len == 0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","val_len","ly_parse_uint")
    ;
    val_str_local._4_4_ = LY_EINVAL;
  }
  else {
    __nptr = strndup(val_str,val_len);
    if (__nptr == (char *)0x0) {
      val_str_local._4_4_ = LY_EMEM;
    }
    else {
      piVar1 = __errno_location();
      *piVar1 = 0;
      uVar2 = strtoull(__nptr,&str,ret_local._4_4_);
      piVar1 = __errno_location();
      if ((*piVar1 == 0) && (str != __nptr)) {
        if ((uStack_28 < uVar2) || ((uVar2 != 0 && (*__nptr == '-')))) {
          ptr._4_4_ = LY_EDENIED;
        }
        else if (*str != '\0') {
          while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*str] & 0x2000) != 0) {
            str = str + 1;
          }
          if (*str != '\0') {
            ptr._4_4_ = LY_EVALID;
          }
        }
      }
      else {
        ptr._4_4_ = LY_EVALID;
      }
      free(__nptr);
      if (ptr._4_4_ == LY_SUCCESS) {
        *puStack_38 = uVar2;
      }
      val_str_local._4_4_ = ptr._4_4_;
    }
  }
  return val_str_local._4_4_;
}

Assistant:

LY_ERR
ly_parse_uint(const char *val_str, size_t val_len, uint64_t max, int base, uint64_t *ret)
{
    LY_ERR rc = LY_SUCCESS;
    char *ptr, *str;
    uint64_t u;

    LY_CHECK_ARG_RET(NULL, val_str, val_str[0], val_len, LY_EINVAL);

    /* duplicate the value to avoid accessing following bytes */
    str = strndup(val_str, val_len);
    LY_CHECK_RET(!str, LY_EMEM);

    /* parse the value */
    errno = 0;
    u = strtoull(str, &ptr, base);
    if (errno || (ptr == str)) {
        /* invalid string */
        rc = LY_EVALID;
    } else if ((u > max) || (u && (str[0] == '-'))) {
        /* invalid number */
        rc = LY_EDENIED;
    } else if (*ptr) {
        while (isspace(*ptr)) {
            ++ptr;
        }
        if (*ptr) {
            /* invalid characters after some number */
            rc = LY_EVALID;
        }
    }

    /* cleanup */
    free(str);
    if (!rc) {
        *ret = u;
    }
    return rc;
}